

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

void luaS_init(lua_State *L)

{
  global_State *pgVar1;
  TString *pTVar2;
  int local_20;
  int local_1c;
  int j;
  int i;
  global_State *g;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  luaS_resize(L,0x80);
  pTVar2 = luaS_newlstr(L,"not enough memory",0x11);
  pgVar1->memerrmsg = pTVar2;
  luaC_fix(L,(GCObject *)pgVar1->memerrmsg);
  for (local_1c = 0; local_1c < 0x35; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      pgVar1->strcache[local_1c][local_20] = pgVar1->memerrmsg;
    }
  }
  return;
}

Assistant:

void luaS_init (lua_State *L) {
  global_State *g = G(L);
  int i, j;
  luaS_resize(L, MINSTRTABSIZE);  /* initial size of string table */
  /* pre-create memory-error message */
  g->memerrmsg = luaS_newliteral(L, MEMERRMSG);
  luaC_fix(L, obj2gco(g->memerrmsg));  /* it should never be collected */
  for (i = 0; i < STRCACHE_N; i++)  /* fill cache with valid strings */
    for (j = 0; j < STRCACHE_M; j++)
      g->strcache[i][j] = g->memerrmsg;
}